

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::store<char_const(&)[15]>
          (atomic_guarded<std::__cxx11::string,std::mutex> *this,char (*newObj) [15])

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x20))->__data);
  std::__cxx11::string::assign((char *)this);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x20));
  return;
}

Assistant:

void store(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
    }